

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O0

void __thiscall kj::Vector<unsigned_long>::setCapacity(Vector<unsigned_long> *this,size_t newSize)

{
  ArrayDisposer *pAVar1;
  ArrayBuilder<unsigned_long> *pAVar2;
  __off_t __length;
  undefined1 local_38 [8];
  ArrayBuilder<unsigned_long> newBuilder;
  size_t newSize_local;
  Vector<unsigned_long> *this_local;
  
  newBuilder.disposer = (ArrayDisposer *)newSize;
  pAVar1 = (ArrayDisposer *)ArrayBuilder<unsigned_long>::size(&this->builder);
  if (newBuilder.disposer < pAVar1) {
    ArrayBuilder<unsigned_long>::truncate(&this->builder,(char *)newBuilder.disposer,__length);
  }
  heapArrayBuilder<unsigned_long>
            ((ArrayBuilder<unsigned_long> *)local_38,(size_t)newBuilder.disposer);
  pAVar2 = mv<kj::ArrayBuilder<unsigned_long>>(&this->builder);
  ArrayBuilder<unsigned_long>::addAll<kj::ArrayBuilder<unsigned_long>>
            ((ArrayBuilder<unsigned_long> *)local_38,pAVar2);
  pAVar2 = mv<kj::ArrayBuilder<unsigned_long>>((ArrayBuilder<unsigned_long> *)local_38);
  ArrayBuilder<unsigned_long>::operator=(&this->builder,pAVar2);
  ArrayBuilder<unsigned_long>::~ArrayBuilder((ArrayBuilder<unsigned_long> *)local_38);
  return;
}

Assistant:

void setCapacity(size_t newSize) {
    if (builder.size() > newSize) {
      builder.truncate(newSize);
    }
    ArrayBuilder<T> newBuilder = heapArrayBuilder<T>(newSize);
    newBuilder.addAll(kj::mv(builder));
    builder = kj::mv(newBuilder);
  }